

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImRect::ClipWithFull(ImRect *this,ImRect *r)

{
  ImVec2 IVar1;
  
  IVar1 = ImClamp(&this->Min,&r->Min,r->Max);
  this->Min = IVar1;
  IVar1 = ImClamp(&this->Max,&r->Min,r->Max);
  this->Max = IVar1;
  return;
}

Assistant:

void        ClipWithFull(const ImRect& r)       { Min = ImClamp(Min, r.Min, r.Max); Max = ImClamp(Max, r.Min, r.Max); }